

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O1

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *ID,UnicodeString *source,
          UnicodeString *target,UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  UVector *this_00;
  UHashtable *hash;
  int32_t iVar1;
  int iVar2;
  UnicodeString *pUVar3;
  undefined4 extraout_var;
  UErrorCode status;
  UErrorCode local_44;
  UnicodeString *local_40;
  UnicodeString *local_38;
  
  local_44 = U_ZERO_ERROR;
  hash = (this->registry).hash;
  local_40 = source;
  local_38 = target;
  pUVar3 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)ID);
  if (pUVar3 == (UnicodeString *)0x0) {
    pUVar3 = (UnicodeString *)0x0;
  }
  else {
    icu_63::UnicodeString::UnicodeString(pUVar3,ID);
  }
  uhash_put_63(hash,pUVar3,adopted,&local_44);
  this_00 = &this->availableIDs;
  if (visible == '\0') {
    removeSTV(this,local_40,local_38,variant);
    UVector::removeElement(this_00,ID);
  }
  else {
    registerSTV(this,local_40,local_38,variant);
    iVar1 = UVector::indexOf(this_00,ID,0);
    if (iVar1 < 0) {
      iVar2 = (*(ID->super_Replaceable).super_UObject._vptr_UObject[7])(ID);
      pUVar3 = (UnicodeString *)CONCAT44(extraout_var,iVar2);
      if (pUVar3 != (UnicodeString *)0x0) {
        icu_63::UnicodeString::getTerminatedBuffer(pUVar3);
        UVector::addElement(this_00,pUVar3,&local_44);
      }
    }
  }
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& ID,
                                           const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UErrorCode status = U_ZERO_ERROR;
    registry.put(ID, adopted, status);
    if (visible) {
        registerSTV(source, target, variant);
        if (!availableIDs.contains((void*) &ID)) {
            UnicodeString *newID = (UnicodeString *)ID.clone();
            // Check to make sure newID was created.
            if (newID != NULL) {
                // NUL-terminate the ID string
                newID->getTerminatedBuffer();
                availableIDs.addElement(newID, status);
            }
        }
    } else {
        removeSTV(source, target, variant);
        availableIDs.removeElement((void*) &ID);
    }
}